

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# url.hpp
# Opt level: O3

void __thiscall m2d::savanna::url::url(url *this,string *url)

{
  bool bVar1;
  size_t sVar2;
  long lVar3;
  pointer psVar4;
  char *pcVar5;
  pointer psVar6;
  cmatch what;
  regex ex;
  match_results<const_char_*,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_> local_d8;
  undefined1 *local_b0 [2];
  undefined1 local_a0 [16];
  string *local_90;
  string *local_88;
  string *local_80;
  string *local_78;
  string *local_70;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_68;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_60;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_58;
  basic_regex<char,_std::__cxx11::regex_traits<char>_> local_50;
  
  local_58 = &(this->scheme_).field_2;
  (this->scheme_)._M_dataplus._M_p = (pointer)local_58;
  (this->scheme_)._M_string_length = 0;
  (this->scheme_).field_2._M_local_buf[0] = '\0';
  local_70 = (string *)&this->host_;
  local_60 = &(this->host_).field_2;
  (this->host_)._M_dataplus._M_p = (pointer)local_60;
  (this->host_)._M_string_length = 0;
  (this->host_).field_2._M_local_buf[0] = '\0';
  local_78 = (string *)&this->port_;
  local_68 = &(this->port_).field_2;
  (this->port_)._M_dataplus._M_p = (pointer)local_68;
  (this->port_)._M_string_length = 0;
  (this->port_).field_2._M_local_buf[0] = '\0';
  local_80 = (string *)&this->path_;
  (this->path_)._M_dataplus._M_p = (pointer)&(this->path_).field_2;
  (this->path_)._M_string_length = 0;
  (this->path_).field_2._M_local_buf[0] = '\0';
  local_88 = (string *)&this->query_;
  (this->query_)._M_dataplus._M_p = (pointer)&(this->query_).field_2;
  (this->query_)._M_string_length = 0;
  (this->query_).field_2._M_local_buf[0] = '\0';
  local_90 = (string *)&this->fragment_;
  (this->fragment_)._M_dataplus._M_p = (pointer)&(this->fragment_).field_2;
  (this->fragment_)._M_string_length = 0;
  (this->fragment_).field_2._M_local_buf[0] = '\0';
  std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::basic_regex
            (&local_50,"(http|https|ws|wss)://([^/ :]+):?([^/ ]*)(/?[^ #?]*)\\x3f?([^ #]*)#?([^ ]*)"
             ,0x10);
  local_d8.
  super_vector<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
  .
  super__Vector_base<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_d8._M_begin = (char *)0x0;
  local_d8.
  super_vector<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
  .
  super__Vector_base<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_d8.
  super_vector<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
  .
  super__Vector_base<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  pcVar5 = (url->_M_dataplus)._M_p;
  sVar2 = strlen(pcVar5);
  bVar1 = std::__detail::
          __regex_algo_impl<char_const*,std::allocator<std::__cxx11::sub_match<char_const*>>,char,std::__cxx11::regex_traits<char>,(std::__detail::_RegexExecutorPolicy)0,true>
                    (pcVar5,pcVar5 + sVar2,&local_d8,&local_50,0);
  if (!bVar1) goto LAB_00121bd0;
  lVar3 = (long)local_d8.
                super_vector<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
                .
                super__Vector_base<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
                ._M_impl.super__Vector_impl_data._M_finish -
          (long)local_d8.
                super_vector<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
                .
                super__Vector_base<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
  if (lVar3 == 0) {
    pcVar5 = local_d8.
             super_vector<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
             .
             super__Vector_base<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
             ._M_impl.super__Vector_impl_data._M_start[-3].super_pair<const_char_*,_const_char_*>.
             first;
LAB_00121943:
    psVar4 = (pointer)((long)local_d8.
                             super_vector<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
                             .
                             super__Vector_base<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
                             ._M_impl.super__Vector_impl_data._M_start + lVar3 + -0x48);
  }
  else {
    psVar4 = local_d8.
             super_vector<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
             .
             super__Vector_base<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
             ._M_impl.super__Vector_impl_data._M_start + 1;
    bVar1 = 0xfffffffffffffffd < (lVar3 >> 3) * -0x5555555555555555 - 5U;
    psVar6 = (pointer)((long)local_d8.
                             super_vector<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
                             .
                             super__Vector_base<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
                             ._M_impl.super__Vector_impl_data._M_start + lVar3 + -0x48);
    if (!bVar1) {
      psVar6 = psVar4;
    }
    pcVar5 = (psVar6->super_pair<const_char_*,_const_char_*>).first;
    if (bVar1) goto LAB_00121943;
  }
  local_b0[0] = local_a0;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_b0,pcVar5,(psVar4->super_pair<const_char_*,_const_char_*>).second);
  std::__cxx11::string::operator=((string *)this,(string *)local_b0);
  if (local_b0[0] != local_a0) {
    operator_delete(local_b0[0]);
  }
  lVar3 = (long)local_d8.
                super_vector<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
                .
                super__Vector_base<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
                ._M_impl.super__Vector_impl_data._M_finish -
          (long)local_d8.
                super_vector<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
                .
                super__Vector_base<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
  if (lVar3 == 0) {
    pcVar5 = local_d8.
             super_vector<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
             .
             super__Vector_base<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
             ._M_impl.super__Vector_impl_data._M_start[-3].super_pair<const_char_*,_const_char_*>.
             first;
LAB_001219bd:
    psVar4 = (pointer)((long)local_d8.
                             super_vector<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
                             .
                             super__Vector_base<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
                             ._M_impl.super__Vector_impl_data._M_start + lVar3 + -0x48);
  }
  else {
    psVar4 = local_d8.
             super_vector<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
             .
             super__Vector_base<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
             ._M_impl.super__Vector_impl_data._M_start + 2;
    bVar1 = 0xfffffffffffffffc < (lVar3 >> 3) * -0x5555555555555555 - 6U;
    psVar6 = (pointer)((long)local_d8.
                             super_vector<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
                             .
                             super__Vector_base<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
                             ._M_impl.super__Vector_impl_data._M_start + lVar3 + -0x48);
    if (!bVar1) {
      psVar6 = psVar4;
    }
    pcVar5 = (psVar6->super_pair<const_char_*,_const_char_*>).first;
    if (bVar1) goto LAB_001219bd;
  }
  local_b0[0] = local_a0;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_b0,pcVar5,(psVar4->super_pair<const_char_*,_const_char_*>).second);
  std::__cxx11::string::operator=(local_70,(string *)local_b0);
  if (local_b0[0] != local_a0) {
    operator_delete(local_b0[0]);
  }
  lVar3 = (long)local_d8.
                super_vector<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
                .
                super__Vector_base<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
                ._M_impl.super__Vector_impl_data._M_finish -
          (long)local_d8.
                super_vector<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
                .
                super__Vector_base<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
  if (lVar3 == 0) {
    pcVar5 = local_d8.
             super_vector<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
             .
             super__Vector_base<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
             ._M_impl.super__Vector_impl_data._M_start[-3].super_pair<const_char_*,_const_char_*>.
             first;
LAB_00121a33:
    psVar4 = (pointer)((long)local_d8.
                             super_vector<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
                             .
                             super__Vector_base<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
                             ._M_impl.super__Vector_impl_data._M_start + lVar3 + -0x48);
  }
  else {
    psVar4 = local_d8.
             super_vector<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
             .
             super__Vector_base<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
             ._M_impl.super__Vector_impl_data._M_start + 3;
    bVar1 = 0xfffffffffffffffb < (lVar3 >> 3) * -0x5555555555555555 - 7U;
    psVar6 = (pointer)((long)local_d8.
                             super_vector<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
                             .
                             super__Vector_base<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
                             ._M_impl.super__Vector_impl_data._M_start + lVar3 + -0x48);
    if (!bVar1) {
      psVar6 = psVar4;
    }
    pcVar5 = (psVar6->super_pair<const_char_*,_const_char_*>).first;
    if (bVar1) goto LAB_00121a33;
  }
  local_b0[0] = local_a0;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_b0,pcVar5,(psVar4->super_pair<const_char_*,_const_char_*>).second);
  std::__cxx11::string::operator=(local_78,(string *)local_b0);
  if (local_b0[0] != local_a0) {
    operator_delete(local_b0[0]);
  }
  lVar3 = (long)local_d8.
                super_vector<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
                .
                super__Vector_base<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
                ._M_impl.super__Vector_impl_data._M_finish -
          (long)local_d8.
                super_vector<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
                .
                super__Vector_base<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
  if (lVar3 == 0) {
    pcVar5 = local_d8.
             super_vector<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
             .
             super__Vector_base<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
             ._M_impl.super__Vector_impl_data._M_start[-3].super_pair<const_char_*,_const_char_*>.
             first;
LAB_00121aa9:
    psVar4 = (pointer)((long)local_d8.
                             super_vector<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
                             .
                             super__Vector_base<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
                             ._M_impl.super__Vector_impl_data._M_start + lVar3 + -0x48);
  }
  else {
    psVar4 = local_d8.
             super_vector<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
             .
             super__Vector_base<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
             ._M_impl.super__Vector_impl_data._M_start + 4;
    bVar1 = 0xfffffffffffffffa < (lVar3 >> 3) * -0x5555555555555555 - 8U;
    psVar6 = (pointer)((long)local_d8.
                             super_vector<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
                             .
                             super__Vector_base<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
                             ._M_impl.super__Vector_impl_data._M_start + lVar3 + -0x48);
    if (!bVar1) {
      psVar6 = psVar4;
    }
    pcVar5 = (psVar6->super_pair<const_char_*,_const_char_*>).first;
    if (bVar1) goto LAB_00121aa9;
  }
  local_b0[0] = local_a0;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_b0,pcVar5,(psVar4->super_pair<const_char_*,_const_char_*>).second);
  std::__cxx11::string::operator=(local_80,(string *)local_b0);
  if (local_b0[0] != local_a0) {
    operator_delete(local_b0[0]);
  }
  lVar3 = (long)local_d8.
                super_vector<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
                .
                super__Vector_base<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
                ._M_impl.super__Vector_impl_data._M_finish -
          (long)local_d8.
                super_vector<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
                .
                super__Vector_base<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
  if (lVar3 == 0) {
    pcVar5 = local_d8.
             super_vector<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
             .
             super__Vector_base<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
             ._M_impl.super__Vector_impl_data._M_start[-3].super_pair<const_char_*,_const_char_*>.
             first;
LAB_00121b1f:
    psVar4 = (pointer)((long)local_d8.
                             super_vector<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
                             .
                             super__Vector_base<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
                             ._M_impl.super__Vector_impl_data._M_start + lVar3 + -0x48);
  }
  else {
    psVar4 = local_d8.
             super_vector<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
             .
             super__Vector_base<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
             ._M_impl.super__Vector_impl_data._M_start + 5;
    bVar1 = 0xfffffffffffffff9 < (lVar3 >> 3) * -0x5555555555555555 - 9U;
    psVar6 = (pointer)((long)local_d8.
                             super_vector<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
                             .
                             super__Vector_base<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
                             ._M_impl.super__Vector_impl_data._M_start + lVar3 + -0x48);
    if (!bVar1) {
      psVar6 = psVar4;
    }
    pcVar5 = (psVar6->super_pair<const_char_*,_const_char_*>).first;
    if (bVar1) goto LAB_00121b1f;
  }
  local_b0[0] = local_a0;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_b0,pcVar5,(psVar4->super_pair<const_char_*,_const_char_*>).second);
  std::__cxx11::string::operator=(local_88,(string *)local_b0);
  if (local_b0[0] != local_a0) {
    operator_delete(local_b0[0]);
  }
  lVar3 = (long)local_d8.
                super_vector<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
                .
                super__Vector_base<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
                ._M_impl.super__Vector_impl_data._M_finish -
          (long)local_d8.
                super_vector<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
                .
                super__Vector_base<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
  if (lVar3 == 0) {
    pcVar5 = local_d8.
             super_vector<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
             .
             super__Vector_base<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
             ._M_impl.super__Vector_impl_data._M_start[-3].super_pair<const_char_*,_const_char_*>.
             first;
LAB_00121b98:
    psVar4 = (pointer)((long)local_d8.
                             super_vector<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
                             .
                             super__Vector_base<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
                             ._M_impl.super__Vector_impl_data._M_start + lVar3 + -0x48);
  }
  else {
    psVar4 = local_d8.
             super_vector<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
             .
             super__Vector_base<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
             ._M_impl.super__Vector_impl_data._M_start + 6;
    bVar1 = 0xfffffffffffffff8 < (lVar3 >> 3) * -0x5555555555555555 - 10U;
    psVar6 = (pointer)((long)local_d8.
                             super_vector<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
                             .
                             super__Vector_base<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
                             ._M_impl.super__Vector_impl_data._M_start + lVar3 + -0x48);
    if (!bVar1) {
      psVar6 = psVar4;
    }
    pcVar5 = (psVar6->super_pair<const_char_*,_const_char_*>).first;
    if (bVar1) goto LAB_00121b98;
  }
  local_b0[0] = local_a0;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_b0,pcVar5,(psVar4->super_pair<const_char_*,_const_char_*>).second);
  std::__cxx11::string::operator=(local_90,(string *)local_b0);
  if (local_b0[0] != local_a0) {
    operator_delete(local_b0[0]);
  }
LAB_00121bd0:
  if (local_d8.
      super_vector<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
      .
      super__Vector_base<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_d8.
                    super_vector<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
                    .
                    super__Vector_base<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
                    ._M_impl.super__Vector_impl_data._M_start);
  }
  std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::~basic_regex(&local_50);
  return;
}

Assistant:

url(std::string url)
		{
			std::regex ex("(http|https|ws|wss)://([^/ :]+):?([^/ ]*)(/?[^ #?]*)\\x3f?([^ #]*)#?([^ ]*)");
			std::cmatch what;
			if (regex_match(url.c_str(), what, ex)) {
				scheme_ = std::string(what[1].first, what[1].second);
				host_ = std::string(what[2].first, what[2].second);
				port_ = std::string(what[3].first, what[3].second);
				path_ = std::string(what[4].first, what[4].second);
				query_ = std::string(what[5].first, what[5].second);
				fragment_ = std::string(what[6].first, what[6].second);
			}
		}